

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::set_error
          (parser<pstore::exchange::import_ns::callbacks> *this,error_code err)

{
  bool bVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_local;
  error_code err_local;
  
  err_local._0_8_ = err._M_cat;
  this_local._0_4_ = err._M_value;
  bVar1 = std::error_code::operator_cast_to_bool(&this->error_);
  if ((bVar1) && (bVar1 = std::error_code::operator_cast_to_bool((error_code *)&this_local), !bVar1)
     ) {
    assert_failed("!error_ || err",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0xe3);
  }
  *(ulong *)&this->error_ = CONCAT44(this_local._4_4_,(int)this_local);
  (this->error_)._M_cat = (error_category *)err_local._0_8_;
  bVar1 = has_error(this);
  return bVar1;
}

Assistant:

bool set_error (std::error_code const err) noexcept {
                PSTORE_ASSERT (!error_ || err);
                error_ = err;
                return this->has_error ();
            }